

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_756638::Target::DumpCompileGroups(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  Value local_68;
  reference local_40;
  CompileGroup *cg;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
  *__range1;
  Target *this_local;
  Value *compileGroups;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __end1 = std::
           vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
           ::begin(&this->CompileGroups);
  cg = (CompileGroup *)
       std::
       vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
       ::end(&this->CompileGroups);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<(anonymous_namespace)::Target::CompileGroup_*,_std::vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>_>
                                     *)&cg), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::Target::CompileGroup_*,_std::vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>_>
               ::operator*(&__end1);
    DumpCompileGroup(&local_68,this,local_40);
    Json::Value::append(__return_storage_ptr__,&local_68);
    Json::Value::~Value(&local_68);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Target::CompileGroup_*,_std::vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCompileGroups()
{
  Json::Value compileGroups = Json::arrayValue;
  for (auto& cg : this->CompileGroups) {
    compileGroups.append(this->DumpCompileGroup(cg));
  }
  return compileGroups;
}